

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyObj.c
# Opt level: O2

void Ivy_ObjDelete(Ivy_Man_t *p,Ivy_Obj_t *pObj,int fFreeTop)

{
  int iVar1;
  Ivy_Obj_t *pIVar2;
  uint uVar3;
  Ivy_Man_t *pIVar4;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *Entry;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Ivy_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyObj.c"
                  ,0x101,"void Ivy_ObjDelete(Ivy_Man_t *, Ivy_Obj_t *, int)");
  }
  if ((fFreeTop != 0) && (pObj->nRefs != 0)) {
    __assert_fail("Ivy_ObjRefs(pObj) == 0 || !fFreeTop",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyObj.c"
                  ,0x102,"void Ivy_ObjDelete(Ivy_Man_t *, Ivy_Obj_t *, int)");
  }
  p->nObjs[*(uint *)&pObj->field_0x8 & 0xf] = p->nObjs[*(uint *)&pObj->field_0x8 & 0xf] + -1;
  p->nDeleted = p->nDeleted + 1;
  Ivy_ObjDisconnect(p,pObj);
  uVar3 = *(uint *)&pObj->field_0x8 & 0xf;
  pIVar4 = p;
  if (uVar3 != 1) {
    if (uVar3 == 2) {
      pIVar4 = (Ivy_Man_t *)&p->vPos;
    }
    else {
      Entry = extraout_RDX;
      if ((uVar3 != 7) || (p->fFanout == 0)) goto LAB_0064a8ca;
      pIVar4 = (Ivy_Man_t *)&p->vBufs;
    }
  }
  Vec_PtrRemove(pIVar4->vPis,pObj);
  Entry = extraout_RDX_00;
LAB_0064a8ca:
  if (fFreeTop == 0) {
    iVar1 = pObj->Id;
    pIVar2 = pObj->pFanout;
    pObj->Id = 0;
    pObj->TravId = 0;
    *(undefined8 *)&pObj->field_0x8 = 0;
    pObj->pFanout = (Ivy_Obj_t *)0x0;
    pObj->pNextFan0 = (Ivy_Obj_t *)0x0;
    pObj->pFanin0 = (Ivy_Obj_t *)0x0;
    pObj->pFanin1 = (Ivy_Obj_t *)0x0;
    pObj->pNextFan1 = (Ivy_Obj_t *)0x0;
    pObj->pPrevFan0 = (Ivy_Obj_t *)0x0;
    pObj->pPrevFan1 = (Ivy_Obj_t *)0x0;
    pObj->pEquiv = (Ivy_Obj_t *)0x0;
    pObj->Id = iVar1;
    pObj->pFanout = pIVar2;
    pObj->nRefs = pObj->nRefs;
  }
  else {
    Vec_PtrWriteEntry(p->vObjs,pObj->Id,Entry);
    pObj->field_0x8 = pObj->field_0x8 & 0xf0;
    *(Ivy_Obj_t **)pObj = p->pListFree;
    p->pListFree = pObj;
  }
  return;
}

Assistant:

void Ivy_ObjDelete( Ivy_Man_t * p, Ivy_Obj_t * pObj, int fFreeTop )
{
    assert( !Ivy_IsComplement(pObj) );
    assert( Ivy_ObjRefs(pObj) == 0 || !fFreeTop );
    // update node counters of the manager
    p->nObjs[pObj->Type]--;
    p->nDeleted++;
    // remove connections
    Ivy_ObjDisconnect( p, pObj );
    // remove PIs/POs from the arrays
    if ( Ivy_ObjIsPi(pObj) )
        Vec_PtrRemove( p->vPis, pObj );
    else if ( Ivy_ObjIsPo(pObj) )
        Vec_PtrRemove( p->vPos, pObj );
    else if ( p->fFanout && Ivy_ObjIsBuf(pObj) )
        Vec_PtrRemove( p->vBufs, pObj );
    // clean and recycle the entry
    if ( fFreeTop )
    {
        // free the node
        Vec_PtrWriteEntry( p->vObjs, pObj->Id, NULL );
        Ivy_ManRecycleMemory( p, pObj );
    }
    else
    {
        int nRefsOld = pObj->nRefs;
        Ivy_Obj_t * pFanout = pObj->pFanout;
        Ivy_ObjClean( pObj );
        pObj->pFanout = pFanout;
        pObj->nRefs = nRefsOld;
    }
}